

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

void __thiscall icu_63::number::impl::SymbolsWrapper::doCleanup(SymbolsWrapper *this)

{
  if (((this->fType == SYMPTR_NS) || (this->fType == SYMPTR_DFS)) &&
     ((this->fPtr).dfs != (DecimalFormatSymbols *)0x0)) {
    (*(((this->fPtr).dfs)->super_UObject)._vptr_UObject[1])();
    return;
  }
  return;
}

Assistant:

void SymbolsWrapper::doCleanup() {
    switch (fType) {
        case SYMPTR_NONE:
            // No action necessary
            break;
        case SYMPTR_DFS:
            delete fPtr.dfs;
            break;
        case SYMPTR_NS:
            delete fPtr.ns;
            break;
    }
}